

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pluginmanager.cc
# Opt level: O2

void __thiscall Typelib::PluginManager::~PluginManager(PluginManager *this)

{
  pointer ppTVar1;
  _Base_ptr p_Var2;
  pointer ppTVar3;
  
  for (p_Var2 = (this->m_importers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_importers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(long **)(p_Var2 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var2 + 2) + 8))();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>_>
  ::clear(&(this->m_importers)._M_t);
  for (p_Var2 = (this->m_exporters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_exporters)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(long **)(p_Var2 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var2 + 2) + 8))();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>_>
           *)this);
  for (ppTVar3 = (this->m_definition_plugins).
                 super__Vector_base<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar3 !=
      (this->m_definition_plugins).
      super__Vector_base<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    if (*ppTVar3 != (TypeDefinitionPlugin *)0x0) {
      (**(code **)(*(long *)*ppTVar3 + 8))();
    }
  }
  ppTVar1 = (this->m_definition_plugins).
            super__Vector_base<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar3 != ppTVar1) {
    (this->m_definition_plugins).
    super__Vector_base<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&(this->m_library_handles).super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::
  _Vector_base<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>::
  ~_Vector_base(&(this->m_definition_plugins).
                 super__Vector_base<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>
               );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>_>
  ::~_Rb_tree(&(this->m_importers)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>_>
               *)this);
  return;
}

Assistant:

PluginManager::~PluginManager()
{
    clear(m_importers);
    clear(m_exporters);
    for (std::vector<TypeDefinitionPlugin*>::iterator it = m_definition_plugins.begin();
            it != m_definition_plugins.end(); ++it)
        delete *it;
    m_definition_plugins.clear();
    //for (vector<void*>::iterator it = m_library_handles.begin(); it != m_library_handles.end(); ++it)
    //    dlclose(*it);
}